

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntrySort(RecyclableObject *function,CallInfo callInfo,...)

{
  Entry *pEVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *this_00;
  code *pcVar7;
  nullptr_t local_d8;
  undefined4 local_cc;
  undefined1 local_c8 [8];
  CompareVarsInfo cvInfo;
  RecyclableObject *compFn;
  undefined1 local_90 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b7d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_90,function,(CallInfo)function_local,
             L"Array.prototype.sort",&stack0x00000000);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b81,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1b83,"(args.Info.Count >= 1)","Should have at least one argument"
                               );
    if (!bVar2) {
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  cvInfo.compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)0x0;
  if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = JavascriptConversion::IsCallable(pvVar6);
    if (bVar2) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
      cvInfo.compareType =
           (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)
           UnsafeVarTo<Js::RecyclableObject>(pvVar6);
    }
    else {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
      if (pvVar6 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = TaggedInt::Is(pvVar6);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar6);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          this_00 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
          if (this_00 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar7 = (code *)invalidInstructionException();
              (*pcVar7)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          local_18 = RecyclableObject::GetTypeId(this_00);
          if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this_00), BVar3 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar7 = (code *)invalidInstructionException();
              (*pcVar7)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
      }
      if (local_18 != TypeIds_Undefined) {
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)__tag.entry.next,-0x7ff5ec34,L"Array.prototype.sort");
      }
    }
  }
  CompareVarsInfo::CompareVarsInfo((CompareVarsInfo *)local_c8);
  local_c8 = (undefined1  [8])__tag.entry.next;
  if (cvInfo.compareType == (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)0x0) {
    local_d8 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=
              ((WriteBarrierPtr<Js::RecyclableObject> *)&cvInfo,&local_d8);
    cvInfo.compFn.ptr = (RecyclableObject *)stringCompare;
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
    callInfo_local = (CallInfo)SortHelper<StringItem>(pvVar6,(CompareVarsInfo *)local_c8);
  }
  else {
    Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=
              ((WriteBarrierPtr<Js::RecyclableObject> *)&cvInfo,
               (RecyclableObject *)cvInfo.compareType);
    pEVar1 = __tag.entry.next;
    pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)cvInfo.compareType);
    pcVar7 = compareVarsCrossContext;
    if ((ScriptContext *)pEVar1 == pSVar4) {
      pcVar7 = compareVars;
    }
    cvInfo.compFn.ptr = (RecyclableObject *)pcVar7;
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
    callInfo_local =
         (CallInfo)SortHelper<Memory::WriteBarrierPtr<void>>(pvVar6,(CompareVarsInfo *)local_c8);
  }
  local_cc = 1;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_90);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptArray::EntrySort(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.sort"));

        Assert(!(callInfo.Flags & CallFlags_New));

        AssertMsg(args.Info.Count >= 1, "Should have at least one argument");

        RecyclableObject* compFn = NULL;
        if (args.Info.Count > 1)
        {
            if (JavascriptConversion::IsCallable(args[1]))
            {
                compFn = UnsafeVarTo<RecyclableObject>(args[1]);
            }
            else
            {
                // Spec mandates that we throw if arg[1] is neither callable nor undefined
                if (JavascriptOperators::GetTypeId(args[1]) != TypeIds_Undefined)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.sort"));
                }
            }
        }

        // CompareVarsInfo struct holds data that will be used by sorting algorithm
        JavascriptArray::CompareVarsInfo cvInfo;
        cvInfo.scriptContext = scriptContext;
        if (compFn != NULL)
        {
            cvInfo.compFn = compFn;
            cvInfo.compareType = scriptContext == compFn->GetScriptContext() ? &compareVars : &compareVarsCrossContext;
            return JavascriptArray::SortHelper<Field(Var)>(args[0], &cvInfo);
        }
        else
        {
            cvInfo.compFn = nullptr;
            cvInfo.compareType = &stringCompare;
            return JavascriptArray::SortHelper<StringItem>(args[0], &cvInfo);
        }
    }